

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastSet.h
# Opt level: O0

void __thiscall CFastSet<int>::GetSet(CFastSet<int> *this,CSet *set)

{
  CSet local_48;
  set<int,_std::less<int>,_std::allocator<int>_> *local_18;
  CSet *set_local;
  CFastSet<int> *this_local;
  
  local_18 = set;
  set_local = (CSet *)this;
  ::CFastSet::operator_cast_to_set(&local_48,(CFastSet *)this);
  std::set<int,_std::less<int>,_std::allocator<int>_>::operator=(local_18,&local_48);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set(&local_48);
  return;
}

Assistant:

void GetSet(CSet* set) const { *set = *this; }